

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

SquareMatrix<std::complex<double>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::operator-=
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *rhs)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  complex<double> *pcVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  int64_t j;
  long lVar9;
  long lVar10;
  int64_t i;
  long lVar11;
  
  lVar7 = rhs->size_;
  if (lVar7 == this->size_) {
    lVar8 = 0;
    for (lVar9 = 0; lVar9 < lVar7; lVar9 = lVar9 + 1) {
      lVar10 = 0;
      for (lVar11 = 0; lVar11 < lVar7; lVar11 = lVar11 + 1) {
        pcVar4 = (this->data_)._M_t.
                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
        pdVar1 = (double *)
                 (((rhs->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                   .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value +
                 lVar10 + rhs->size_ * lVar8);
        dVar5 = pdVar1[1];
        pdVar2 = (double *)(pcVar4->_M_value + lVar10 + lVar7 * lVar8);
        dVar6 = pdVar2[1];
        pdVar3 = (double *)(pcVar4->_M_value + lVar10 + lVar7 * lVar8);
        *pdVar3 = *pdVar2 - *pdVar1;
        pdVar3[1] = dVar6 - dVar5;
        lVar7 = this->size_;
        lVar10 = lVar10 + 0x10;
      }
      lVar8 = lVar8 + 0x10;
    }
    return this;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0xa4,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<double>>::operator-=(const SquareMatrix<T> &) [T = std::complex<double>]"
               );
}

Assistant:

inline SquareMatrix< T >& operator-=( const SquareMatrix< T >& rhs ) {
          assert( rhs.size() == size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              (*this)(i,j) -= rhs(i,j) ;
            }
          }
          return *this ;
        }